

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<1>::operator()
          (_defaultInitializer<1> *this,shared_ptr<Assimp::Blender::Base> *out,char *reason)

{
  Logger *this_00;
  _defaultInitializer<0> local_21;
  char *local_20;
  char *reason_local;
  shared_ptr<Assimp::Blender::Base> *out_local;
  _defaultInitializer<1> *this_local;
  
  local_20 = reason;
  reason_local = (char *)out;
  out_local = (shared_ptr<Assimp::Blender::Base> *)this;
  this_00 = DefaultLogger::get();
  Logger::warn(this_00,local_20);
  _defaultInitializer<0>::operator()
            (&local_21,(shared_ptr<Assimp::Blender::Base> *)reason_local,(char *)0x0);
  return;
}

Assistant:

void operator ()(T& out, const char* reason = "<add reason>") {
        ASSIMP_LOG_WARN(reason);

        // ... and let the show go on
        _defaultInitializer<0 /*ErrorPolicy_Igno*/>()(out);
    }